

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

char * __thiscall phosg::dirname(phosg *this,char *__path)

{
  char *pcVar1;
  size_type __n;
  size_type sVar2;
  
  if (*(size_type *)(__path + 8) == 0) {
LAB_0010e633:
    __n = 0xffffffffffffffff;
  }
  else {
    sVar2 = *(size_type *)(__path + 8);
    do {
      __n = sVar2 - 1;
      if (sVar2 == 0) goto LAB_0010e633;
      pcVar1 = (char *)(*(long *)__path + -1 + sVar2);
      sVar2 = __n;
    } while (*pcVar1 != '/');
  }
  if (__n == 0xffffffffffffffff) {
    *(phosg **)this = this + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,0,__n);
  }
  return (char *)this;
}

Assistant:

std::string dirname(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? "" : filename.substr(0, slash_pos);
}